

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_test.cc
# Opt level: O3

void __thiscall
test_libaom::AV1CornerMatch::AV1CornerMatchTest::RunCheckOutput(AV1CornerMatchTest *this)

{
  ACMRandom *this_00;
  internal iVar1;
  undefined8 *puVar2;
  AV1CornerMatchTest *pAVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ParamType *pPVar8;
  pointer *__ptr;
  int y;
  SEARCH_METHODS *pSVar9;
  int y_00;
  int x;
  int x_00;
  bool bVar10;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  internal local_c0 [8];
  undefined8 *local_b8;
  AssertHelper local_b0;
  bool simd_valid2;
  bool simd_valid1;
  bool c_valid2;
  bool c_valid1;
  double c_mean1;
  double c_one_over_stddev1;
  _Head_base<0UL,_unsigned_char_*,_false> local_90;
  _Head_base<0UL,_unsigned_char_*,_false> local_88;
  double c_one_over_stddev2;
  double c_mean2;
  int local_6c;
  AV1CornerMatchTest *local_68;
  double simd_corr;
  double c_corr;
  double simd_one_over_stddev2;
  double simd_mean2;
  double simd_one_over_stddev1;
  double simd_mean1;
  
  local_88._M_head_impl = (uchar *)operator_new__(0x4000,(nothrow_t *)&std::nothrow);
  local_90._M_head_impl = (uchar *)operator_new__(0x4000,(nothrow_t *)&std::nothrow);
  c_mean1 = 0.0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            (local_c0,"input1","nullptr",
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_88,
             (void **)&c_mean1);
  puVar2 = local_b8;
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&c_mean1);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_one_over_stddev1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x5b,(char *)pSVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_one_over_stddev1,(Message *)&c_mean1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_one_over_stddev1);
    if (c_mean1 != 0.0) {
      (**(code **)(*(long *)c_mean1 + 8))();
    }
    if (local_b8 == (undefined8 *)0x0) goto LAB_004053d9;
    if ((undefined8 *)*local_b8 != local_b8 + 2) {
      operator_delete((undefined8 *)*local_b8);
    }
  }
  else {
    if (local_b8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b8 != local_b8 + 2) {
        operator_delete((undefined8 *)*local_b8);
      }
      operator_delete(puVar2);
    }
    c_mean1 = 0.0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
              (local_c0,"input2","nullptr",
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_90,
               (void **)&c_mean1);
    puVar2 = local_b8;
    if (local_c0[0] != (internal)0x0) {
      if (local_b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_b8 != local_b8 + 2) {
          operator_delete((undefined8 *)*local_b8);
        }
        operator_delete(puVar2);
      }
      pPVar8 = testing::
               WithParamInterface<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
               ::GetParam();
      GenerateInput(this,local_88._M_head_impl,local_90._M_head_impl,0x80,0x80,
                    (pPVar8->
                    super__Tuple_impl<0UL,_int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>
                    ).super__Head_base<0UL,_int,_false>._M_head_impl);
      this_00 = &this->rnd_;
      local_6c = 999;
      local_68 = this;
      while( true ) {
        uVar4 = testing::internal::Random::Generate(&this_00->random_,0x71);
        uVar5 = testing::internal::Random::Generate(&this_00->random_,0x71);
        uVar6 = testing::internal::Random::Generate(&this_00->random_,0x71);
        uVar7 = testing::internal::Random::Generate(&this_00->random_,0x71);
        x = uVar4 + 7;
        y = uVar5 + 7;
        c_valid1 = aom_compute_mean_stddev_c
                             (local_88._M_head_impl,0x80,x,y,&c_mean1,&c_one_over_stddev1);
        x_00 = uVar6 + 7;
        y_00 = uVar7 + 7;
        c_valid2 = aom_compute_mean_stddev_c
                             (local_90._M_head_impl,0x80,x_00,y_00,&c_mean2,&c_one_over_stddev2);
        pAVar3 = local_68;
        simd_valid1 = (*local_68->target_compute_mean_stddev_func)
                                (local_88._M_head_impl,0x80,x,y,&simd_mean1,&simd_one_over_stddev1);
        simd_valid2 = (*pAVar3->target_compute_mean_stddev_func)
                                (local_90._M_head_impl,0x80,x_00,y_00,&simd_mean2,
                                 &simd_one_over_stddev2);
        c_corr = aom_compute_correlation_c
                           (local_88._M_head_impl,0x80,x,y,c_mean1,c_one_over_stddev1,
                            local_90._M_head_impl,0x80,x_00,y_00,c_mean2,c_one_over_stddev2);
        simd_corr = (*local_68->target_compute_corr_func)
                              (local_88._M_head_impl,0x80,x,y,c_mean1,c_one_over_stddev1,
                               local_90._M_head_impl,0x80,x_00,y_00,c_mean2,c_one_over_stddev2);
        testing::internal::CmpHelperEQ<bool,bool>
                  (local_c0,"simd_valid1","c_valid1",&simd_valid1,&c_valid1);
        puVar2 = local_b8;
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c8);
          if (local_b8 == (undefined8 *)0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = (SEARCH_METHODS *)*local_b8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x83,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            goto LAB_004053d1;
          }
          goto LAB_004053d9;
        }
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar2);
        }
        testing::internal::CmpHelperEQ<bool,bool>
                  (local_c0,"simd_valid2","c_valid2",&simd_valid2,&c_valid2);
        puVar2 = local_b8;
        if (local_c0[0] == (internal)0x0) break;
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar2);
        }
        testing::internal::CmpHelperEQ<double,double>
                  (local_c0,"simd_mean1","c_mean1",&simd_mean1,&c_mean1);
        puVar2 = local_b8;
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c8);
          if (local_b8 == (undefined8 *)0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = (SEARCH_METHODS *)*local_b8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x85,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            goto LAB_004053d1;
          }
          goto LAB_004053d9;
        }
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar2);
        }
        testing::internal::CmpHelperEQ<double,double>
                  (local_c0,"simd_one_over_stddev1","c_one_over_stddev1",&simd_one_over_stddev1,
                   &c_one_over_stddev1);
        puVar2 = local_b8;
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c8);
          if (local_b8 == (undefined8 *)0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = (SEARCH_METHODS *)*local_b8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x86,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            goto LAB_004053d1;
          }
          goto LAB_004053d9;
        }
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar2);
        }
        testing::internal::CmpHelperEQ<double,double>
                  (local_c0,"simd_mean2","c_mean2",&simd_mean2,&c_mean2);
        puVar2 = local_b8;
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c8);
          if (local_b8 == (undefined8 *)0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = (SEARCH_METHODS *)*local_b8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x87,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            goto LAB_004053d1;
          }
          goto LAB_004053d9;
        }
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar2);
        }
        testing::internal::CmpHelperEQ<double,double>
                  (local_c0,"simd_one_over_stddev2","c_one_over_stddev2",&simd_one_over_stddev2,
                   &c_one_over_stddev2);
        puVar2 = local_b8;
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c8);
          if (local_b8 == (undefined8 *)0x0) {
            pSVar9 = "";
          }
          else {
            pSVar9 = (SEARCH_METHODS *)*local_b8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x88,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
          if (local_b8 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_b8 != local_b8 + 2) {
              operator_delete((undefined8 *)*local_b8);
            }
            goto LAB_004053d1;
          }
          goto LAB_004053d9;
        }
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar2);
        }
        testing::internal::CmpHelperEQ<double,double>
                  (local_c0,"simd_corr","c_corr",&simd_corr,&c_corr);
        iVar1 = local_c0[0];
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_c8);
          pSVar9 = "";
          if (local_b8 != (undefined8 *)0x0) {
            pSVar9 = (SEARCH_METHODS *)*local_b8;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                     ,0x89,(char *)pSVar9);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          if (local_c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_c8._M_head_impl + 8))();
          }
        }
        puVar2 = local_b8;
        if (local_b8 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_b8 != local_b8 + 2) {
            operator_delete((undefined8 *)*local_b8);
          }
          operator_delete(puVar2);
        }
        bVar10 = local_6c == 0;
        local_6c = local_6c + -1;
        if ((iVar1 == (internal)0x0) || (bVar10)) goto LAB_004053d9;
      }
      testing::Message::Message((Message *)&local_c8);
      if (local_b8 == (undefined8 *)0x0) {
        pSVar9 = "";
      }
      else {
        pSVar9 = (SEARCH_METHODS *)*local_b8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
                 ,0x84,(char *)pSVar9);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
      if (local_b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_b8 != local_b8 + 2) {
          operator_delete((undefined8 *)*local_b8);
        }
        goto LAB_004053d1;
      }
      goto LAB_004053d9;
    }
    testing::Message::Message((Message *)&c_mean1);
    if (local_b8 == (undefined8 *)0x0) {
      pSVar9 = "";
    }
    else {
      pSVar9 = (SEARCH_METHODS *)*local_b8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&c_one_over_stddev1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/corner_match_test.cc"
               ,0x5c,(char *)pSVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&c_one_over_stddev1,(Message *)&c_mean1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c_one_over_stddev1);
    if (c_mean1 != 0.0) {
      (**(code **)(*(long *)c_mean1 + 8))();
    }
    if (local_b8 == (undefined8 *)0x0) goto LAB_004053d9;
    if ((undefined8 *)*local_b8 != local_b8 + 2) {
      operator_delete((undefined8 *)*local_b8);
    }
  }
LAB_004053d1:
  operator_delete(local_b8);
LAB_004053d9:
  if (local_90._M_head_impl != (uint8_t *)0x0) {
    operator_delete__(local_90._M_head_impl);
  }
  if (local_88._M_head_impl != (uint8_t *)0x0) {
    operator_delete__(local_88._M_head_impl);
  }
  return;
}

Assistant:

void AV1CornerMatchTest::RunCheckOutput() {
  const int w = 128, h = 128;
  const int num_iters = 1000;

  std::unique_ptr<uint8_t[]> input1(new (std::nothrow) uint8_t[w * h]);
  std::unique_ptr<uint8_t[]> input2(new (std::nothrow) uint8_t[w * h]);
  ASSERT_NE(input1, nullptr);
  ASSERT_NE(input2, nullptr);

  // Test the two extreme cases:
  // i) Random data, should have correlation close to 0
  // ii) Linearly related data + noise, should have correlation close to 1
  int mode = GET_PARAM(0);
  GenerateInput(&input1[0], &input2[0], w, h, mode);

  for (int i = 0; i < num_iters; ++i) {
    int x1 = MATCH_SZ_BY2 + rnd_.PseudoUniform(w + 1 - MATCH_SZ);
    int y1 = MATCH_SZ_BY2 + rnd_.PseudoUniform(h + 1 - MATCH_SZ);
    int x2 = MATCH_SZ_BY2 + rnd_.PseudoUniform(w + 1 - MATCH_SZ);
    int y2 = MATCH_SZ_BY2 + rnd_.PseudoUniform(h + 1 - MATCH_SZ);

    double c_mean1, c_one_over_stddev1, c_mean2, c_one_over_stddev2;
    bool c_valid1 = aom_compute_mean_stddev_c(input1.get(), w, x1, y1, &c_mean1,
                                              &c_one_over_stddev1);
    bool c_valid2 = aom_compute_mean_stddev_c(input2.get(), w, x2, y2, &c_mean2,
                                              &c_one_over_stddev2);

    double simd_mean1, simd_one_over_stddev1, simd_mean2, simd_one_over_stddev2;
    bool simd_valid1 = target_compute_mean_stddev_func(
        input1.get(), w, x1, y1, &simd_mean1, &simd_one_over_stddev1);
    bool simd_valid2 = target_compute_mean_stddev_func(
        input2.get(), w, x2, y2, &simd_mean2, &simd_one_over_stddev2);

    // Run the correlation calculation even if one of the "valid" flags is
    // false, i.e. if one of the patches doesn't have enough variance. This is
    // safe because any potential division by 0 is caught in
    // aom_compute_mean_stddev(), and one_over_stddev is set to 0 instead.
    // This causes aom_compute_correlation() to return 0, without causing a
    // division by 0.
    const double c_corr = aom_compute_correlation_c(
        input1.get(), w, x1, y1, c_mean1, c_one_over_stddev1, input2.get(), w,
        x2, y2, c_mean2, c_one_over_stddev2);
    const double simd_corr = target_compute_corr_func(
        input1.get(), w, x1, y1, c_mean1, c_one_over_stddev1, input2.get(), w,
        x2, y2, c_mean2, c_one_over_stddev2);

    ASSERT_EQ(simd_valid1, c_valid1);
    ASSERT_EQ(simd_valid2, c_valid2);
    ASSERT_EQ(simd_mean1, c_mean1);
    ASSERT_EQ(simd_one_over_stddev1, c_one_over_stddev1);
    ASSERT_EQ(simd_mean2, c_mean2);
    ASSERT_EQ(simd_one_over_stddev2, c_one_over_stddev2);
    ASSERT_EQ(simd_corr, c_corr);
  }
}